

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer(int64_t i,Nonnull<char_*> buffer)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint64_t uVar5;
  long *plVar6;
  
  if (i < 0) {
    *buffer = '-';
    buffer = buffer + 1;
    i = -i;
  }
  if ((ulong)i >> 0x20 == 0) {
    if ((ulong)i < 10) {
      *buffer = (byte)i | 0x30;
      plVar6 = (long *)((long)buffer + 1);
      goto LAB_003cef2f;
    }
    if ((ulong)i < 100000000) {
      uVar5 = lts_20250127::anon_unknown_0::PrepareEightDigits((uint32_t)i);
      if (uVar5 == 0) goto LAB_003cef44;
      uVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      *(uint64_t *)buffer = uVar5 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
      plVar6 = (long *)((long)buffer - (uVar1 >> 3 & 0x1fffffff));
    }
    else {
      uVar5 = lts_20250127::anon_unknown_0::PrepareEightDigits
                        ((uint32_t)((i & 0xffffffffU) % 100000000));
      plVar6 = (long *)lts_20250127::anon_unknown_0::EncodeHundred
                                 ((uint32_t)((i & 0xffffffffU) / 100000000),buffer);
      *plVar6 = uVar5 + 0x3030303030303030;
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = i;
    if ((ulong)i < 10000000000000000) {
      uVar5 = lts_20250127::anon_unknown_0::PrepareEightDigits
                        (SUB164(auVar2 / ZEXT816(100000000),0));
      if (uVar5 == 0) {
LAB_003cef44:
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/numbers.cc"
                      ,0xf5,
                      "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      *(uint64_t *)buffer = uVar5 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
      plVar6 = (long *)((long)buffer - (uVar1 >> 3 & 0x1fffffff));
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = i;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(auVar2 / ZEXT816(100000000),0);
      uVar5 = lts_20250127::anon_unknown_0::PrepareEightDigits
                        (SUB164(auVar4 % ZEXT816(100000000),0));
      plVar6 = (long *)lts_20250127::anon_unknown_0::EncodeTenThousand
                                 (SUB164(auVar3 / ZEXT816(10000000000000000),0),buffer);
      *plVar6 = uVar5 + 0x3030303030303030;
    }
    plVar6 = plVar6 + 1;
    uVar5 = lts_20250127::anon_unknown_0::PrepareEightDigits((uint32_t)((ulong)i % 100000000));
    *plVar6 = uVar5 + 0x3030303030303030;
  }
  plVar6 = plVar6 + 1;
LAB_003cef2f:
  *(char *)plVar6 = '\0';
  return (Nonnull<char_*>)plVar6;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int64_t i, absl::Nonnull<char*> buffer) {
  uint64_t u = static_cast<uint64_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU64(u, buffer);
  *buffer = '\0';
  return buffer;
}